

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

AActor * RoughBlockCheck(AActor *mo,int index,void *param)

{
  bool bVar1;
  int iVar2;
  double x;
  double y;
  FBlockNode *local_38;
  FBlockNode *link;
  BlockCheckInfo *info;
  void *param_local;
  int index_local;
  AActor *mo_local;
  
  local_38 = blocklinks[index];
  do {
    if (local_38 == (FBlockNode *)0x0) {
      return (AActor *)0x0;
    }
    if ((local_38->Me != mo) &&
       (((*param & 1) == 0 || (bVar1 = AActor::CanSeek(mo,local_38->Me), bVar1)))) {
      if ((*(byte *)((long)param + 1) & 1) != 0) {
        x = AActor::X(local_38->Me);
        y = AActor::Y(local_38->Me);
        iVar2 = P_PointOnDivlineSide(x,y,(divline_t *)((long)param + 8));
        if (iVar2 != 0) goto LAB_0059eb56;
      }
      bVar1 = AActor::IsOkayToAttack(mo,local_38->Me);
      if (bVar1) {
        return local_38->Me;
      }
    }
LAB_0059eb56:
    local_38 = local_38->NextActor;
  } while( true );
}

Assistant:

static AActor *RoughBlockCheck (AActor *mo, int index, void *param)
{
	BlockCheckInfo *info = (BlockCheckInfo *)param;

	FBlockNode *link;

	for (link = blocklinks[index]; link != NULL; link = link->NextActor)
	{
		if (link->Me != mo)
		{
			if (info->onlyseekable && !mo->CanSeek(link->Me))
			{
				continue;
			}
			if (info->frontonly && P_PointOnDivlineSide(link->Me->X(), link->Me->Y(), &info->frontline) != 0)
			{
				continue;
			}
			if (mo->IsOkayToAttack (link->Me))
			{
				return link->Me;
			}
		}
	}
	return NULL;
}